

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

qcc_generator_ptr
qcc_gen_transform(qcc_context *ctx,size_t item_size,qcc_generator_ptr src_gen,
                 qcc_transform_fn transform,void *params)

{
  qcc_generator_ptr pqVar1;
  
  pqVar1 = (qcc_generator_ptr)qcc_arena_alloc(ctx->arena,0x30);
  pqVar1->context = ctx;
  pqVar1->type_size = item_size;
  pqVar1->generate = qcc_generate_transform;
  pqVar1[1].context = (qcc_context *)src_gen;
  pqVar1[1].type_size = (size_t)transform;
  pqVar1[1].generate = (qcc_generate_fn)params;
  return pqVar1;
}

Assistant:

qcc_generator_ptr qcc_gen_transform(struct qcc_context *ctx, size_t item_size,
                                    qcc_generator_ptr src_gen,
                                    qcc_transform_fn transform,
                                    const void *params)
{
    QCC_ARENA_POD(ctx->arena, qcc_generator_transform, res);
    res->base.context = ctx;
    res->base.type_size = item_size;
    res->base.generate = qcc_generate_transform;
    res->src_gen = src_gen;
    res->transform = transform;
    res->params = params;
    return &res->base;
}